

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O3

void av1_dist_wtd_comp_weight_assign
               (AV1_COMMON *cm,MB_MODE_INFO *mbmi,int *fwd_offset,int *bck_offset,
               int *use_dist_wtd_comp_avg,int is_compound)

{
  uint uVar1;
  RefCntBuffer *pRVar2;
  int *piVar3;
  uint uVar4;
  uint uVar5;
  RefCntBuffer *pRVar6;
  uint uVar7;
  int m;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  
  if ((is_compound == 0) || ((mbmi->field_0xa8 & 2) != 0)) {
    *fwd_offset = 8;
    *bck_offset = 8;
    *use_dist_wtd_comp_avg = 0;
    return;
  }
  *use_dist_wtd_comp_avg = 1;
  if (((byte)(mbmi->ref_frame[0] - 1U) < 8) &&
     ((long)cm->remapped_ref_idx[(byte)mbmi->ref_frame[0] - 1] != -1)) {
    pRVar2 = cm->ref_frame_map[cm->remapped_ref_idx[(byte)mbmi->ref_frame[0] - 1]];
  }
  else {
    pRVar2 = (RefCntBuffer *)0x0;
  }
  uVar4 = 0;
  if (((byte)(mbmi->ref_frame[1] - 1U) < 8) &&
     ((long)cm->remapped_ref_idx[(byte)mbmi->ref_frame[1] - 1] != -1)) {
    pRVar6 = cm->ref_frame_map[cm->remapped_ref_idx[(byte)mbmi->ref_frame[1] - 1]];
  }
  else {
    pRVar6 = (RefCntBuffer *)0x0;
  }
  if (pRVar2 != (RefCntBuffer *)0x0) {
    uVar4 = pRVar2->order_hint;
  }
  uVar1 = 0;
  uVar7 = 0;
  if (pRVar6 != (RefCntBuffer *)0x0) {
    uVar7 = pRVar6->order_hint;
  }
  uVar5 = 0;
  if ((cm->seq_params->order_hint_info).enable_order_hint != 0) {
    uVar5 = cm->cur_frame->order_hint;
    uVar7 = uVar7 - uVar5;
    uVar8 = 1 << ((byte)(cm->seq_params->order_hint_info).order_hint_bits_minus_1 & 0x1f);
    uVar1 = (uVar8 - 1 & uVar7) - (uVar7 & uVar8);
    uVar7 = -uVar1;
    if (0 < (int)uVar1) {
      uVar7 = uVar1;
    }
    uVar1 = 0x1f;
    if (uVar7 < 0x1f) {
      uVar1 = uVar7;
    }
    uVar5 = uVar5 - uVar4;
    uVar5 = (uVar8 - 1 & uVar5) - (uVar5 & uVar8);
  }
  uVar4 = -uVar5;
  if (0 < (int)uVar5) {
    uVar4 = uVar5;
  }
  uVar7 = 0x1f;
  if (uVar4 < 0x1f) {
    uVar7 = uVar4;
  }
  uVar8 = (uint)(uVar1 <= uVar4);
  if ((uVar1 == 0) || (uVar5 == 0)) {
    *fwd_offset = quant_dist_lookup_table[3][uVar8];
    piVar3 = quant_dist_lookup_table[3] + (uVar4 < uVar1);
  }
  else {
    uVar9 = 0;
    do {
      iVar11 = *(int *)((long)quant_dist_weight[uVar9] + (ulong)(uVar8 * 4)) * uVar1;
      iVar10 = quant_dist_weight[uVar9][uVar4 < uVar1] * uVar7;
      if ((uVar4 < uVar1 && iVar11 < iVar10) || (uVar4 >= uVar1 && iVar10 < iVar11))
      goto LAB_003a1f71;
      uVar9 = uVar9 + 1;
    } while (uVar9 != 3);
    uVar9 = 3;
LAB_003a1f71:
    *fwd_offset = quant_dist_lookup_table[uVar9 & 0xffffffff][uVar8];
    piVar3 = quant_dist_lookup_table[uVar9 & 0xffffffff] + (uVar4 < uVar1);
  }
  *bck_offset = *piVar3;
  return;
}

Assistant:

void av1_dist_wtd_comp_weight_assign(const AV1_COMMON *cm,
                                     const MB_MODE_INFO *mbmi, int *fwd_offset,
                                     int *bck_offset,
                                     int *use_dist_wtd_comp_avg,
                                     int is_compound) {
  assert(fwd_offset != NULL && bck_offset != NULL);
  if (!is_compound || mbmi->compound_idx) {
    *fwd_offset = 8;
    *bck_offset = 8;
    *use_dist_wtd_comp_avg = 0;
    return;
  }

  *use_dist_wtd_comp_avg = 1;
  const RefCntBuffer *const bck_buf = get_ref_frame_buf(cm, mbmi->ref_frame[0]);
  const RefCntBuffer *const fwd_buf = get_ref_frame_buf(cm, mbmi->ref_frame[1]);
  const int cur_frame_index = cm->cur_frame->order_hint;
  int bck_frame_index = 0, fwd_frame_index = 0;

  if (bck_buf != NULL) bck_frame_index = bck_buf->order_hint;
  if (fwd_buf != NULL) fwd_frame_index = fwd_buf->order_hint;

  int d0 = clamp(abs(get_relative_dist(&cm->seq_params->order_hint_info,
                                       fwd_frame_index, cur_frame_index)),
                 0, MAX_FRAME_DISTANCE);
  int d1 = clamp(abs(get_relative_dist(&cm->seq_params->order_hint_info,
                                       cur_frame_index, bck_frame_index)),
                 0, MAX_FRAME_DISTANCE);

  const int order = d0 <= d1;

  if (d0 == 0 || d1 == 0) {
    *fwd_offset = quant_dist_lookup_table[3][order];
    *bck_offset = quant_dist_lookup_table[3][1 - order];
    return;
  }

  int i;
  for (i = 0; i < 3; ++i) {
    int c0 = quant_dist_weight[i][order];
    int c1 = quant_dist_weight[i][!order];
    int d0_c0 = d0 * c0;
    int d1_c1 = d1 * c1;
    if ((d0 > d1 && d0_c0 < d1_c1) || (d0 <= d1 && d0_c0 > d1_c1)) break;
  }

  *fwd_offset = quant_dist_lookup_table[i][order];
  *bck_offset = quant_dist_lookup_table[i][1 - order];
}